

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void example2(string *fileNameIn,string *fileNameOut)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pgVar2;
  size_t __n;
  void *__buf;
  vector<gdsSTR,_std::allocator<gdsSTR>_> arrSTR;
  gdscpp fooGDS;
  string local_1a8;
  vector<gdsSTR,_std::allocator<gdsSTR>_> local_188;
  vector<gdsSTR,_std::allocator<gdsSTR>_> local_170;
  gdsSREF local_158;
  gdscpp local_e0;
  
  gdscpp::gdscpp(&local_e0);
  local_188.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_188.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::resize(&local_188,1);
  std::__cxx11::string::_M_replace
            ((ulong)(local_188.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1),0,
             (char *)local_188.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].name._M_string_length,0x1170e6);
  pgVar2 = local_188.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
           super__Vector_impl_data._M_finish;
  paVar1 = &local_1a8.field_2;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"arrow_box","");
  drawSREF(&local_158,&local_1a8,0,0);
  std::vector<gdsSREF,_std::allocator<gdsSREF>_>::emplace_back<gdsSREF>(&pgVar2[-1].SREF,&local_158)
  ;
  gdsSREF::~gdsSREF(&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  pgVar2 = local_188.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"arrow_box","");
  __n = 500;
  drawSREF(&local_158,&local_1a8,500,500,0.0,1.0,false);
  std::vector<gdsSREF,_std::allocator<gdsSREF>_>::emplace_back<gdsSREF>(&pgVar2[-1].SREF,&local_158)
  ;
  gdsSREF::~gdsSREF(&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e0.GDSfileName,fileNameIn);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::vector(&local_170,&local_188);
  gdscpp::setSTR(&local_e0,&local_170);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::~vector(&local_170);
  gdscpp::write(&local_e0,(int)fileNameOut,__buf,__n);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::~vector(&local_188);
  gdscpp::~gdscpp(&local_e0);
  return;
}

Assistant:

void example2(const string &fileNameIn, const string &fileNameOut)
{
  gdscpp fooGDS;
  vector<gdsSTR> arrSTR;
  arrSTR.resize(arrSTR.size() + 1);

  vector<int> corX;
  vector<int> corY;

  arrSTR.back().name = "example2";
  arrSTR.back().SREF.push_back(drawSREF("arrow_box", 0, 0));
  arrSTR.back().SREF.push_back(drawSREF("arrow_box", 500, 500, 0, 1, false));

  fooGDS.importGDSfile(fileNameIn);
  fooGDS.setSTR(arrSTR);
  fooGDS.write(fileNameOut);
}